

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void dealloc_thread_data_src_diff_buf(AV1_COMP *cpi,int num_workers)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  EncWorkerData *thread_data;
  int i;
  int in_stack_ffffffffffffffdc;
  macroblock *mb;
  undefined4 local_10;
  
  for (local_10 = in_ESI + -1; -1 < local_10; local_10 = local_10 + -1) {
    lVar1 = *(long *)(in_RDI + 0x9ae88) + (long)local_10 * 0x1d0;
    if (*(long *)(lVar1 + 8) != in_RDI + 0x15030) {
      mb = *(macroblock **)(lVar1 + 8);
      av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
      av1_dealloc_src_diff_buf(mb,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

static void dealloc_thread_data_src_diff_buf(AV1_COMP *cpi, int num_workers) {
  for (int i = num_workers - 1; i >= 0; --i) {
    EncWorkerData *const thread_data = &cpi->mt_info.tile_thr_data[i];
    if (thread_data->td != &cpi->td)
      av1_dealloc_src_diff_buf(&thread_data->td->mb,
                               av1_num_planes(&cpi->common));
  }
}